

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_post_rest(connectdata *conn)

{
  SessionHandle *pSVar1;
  CURLcode CVar2;
  char *local_40;
  SessionHandle *data;
  FTP *ftp;
  CURLcode result;
  connectdata *conn_local;
  
  pSVar1 = conn->data;
  if (((conn->data->state).proto.ftp)->transfer == FTPTRANSFER_BODY) {
    if (((pSVar1->set).ftp_use_port & 1U) == 0) {
      if (((pSVar1->set).ftp_use_pret & 1U) == 0) {
        ftp._4_4_ = ftp_state_use_pasv(conn);
      }
      else {
        if ((conn->proto).ftpc.file == (char *)0x0) {
          if ((pSVar1->set).str[4] == (char *)0x0) {
            local_40 = "LIST";
            if (((pSVar1->set).ftp_list_only & 1U) != 0) {
              local_40 = "NLST";
            }
          }
          else {
            local_40 = (pSVar1->set).str[4];
          }
          CVar2 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"PRET %s",local_40);
        }
        else if (((pSVar1->set).upload & 1U) == 0) {
          CVar2 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"PRET RETR %s",(conn->proto).ftpc.file);
        }
        else {
          CVar2 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"PRET STOR %s",(conn->proto).ftpc.file);
        }
        if (CVar2 != CURLE_OK) {
          return CVar2;
        }
        state(conn,FTP_PRET);
        ftp._4_4_ = CURLE_OK;
      }
    }
    else {
      ftp._4_4_ = ftp_state_use_port(conn,EPRT);
    }
  }
  else {
    state(conn,FTP_RETR_PREQUOTE);
    ftp._4_4_ = ftp_state_quote(conn,true,FTP_RETR_PREQUOTE);
  }
  return ftp._4_4_;
}

Assistant:

static CURLcode ftp_state_post_rest(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = conn->data->state.proto.ftp;
  struct SessionHandle *data = conn->data;

  if(ftp->transfer != FTPTRANSFER_BODY) {
    /* doesn't transfer any data */

    /* still possibly do PRE QUOTE jobs */
    state(conn, FTP_RETR_PREQUOTE);
    result = ftp_state_quote(conn, TRUE, FTP_RETR_PREQUOTE);
  }
  else if(data->set.ftp_use_port) {
    /* We have chosen to use the PORT (or similar) command */
    result = ftp_state_use_port(conn, EPRT);
  }
  else {
    /* We have chosen (this is default) to use the PASV (or similar) command */
    if(data->set.ftp_use_pret) {
      /* The user has requested that we send a PRET command
         to prepare the server for the upcoming PASV */
      if(!conn->proto.ftpc.file) {
        PPSENDF(&conn->proto.ftpc.pp, "PRET %s",
                data->set.str[STRING_CUSTOMREQUEST]?
                data->set.str[STRING_CUSTOMREQUEST]:
                (data->set.ftp_list_only?"NLST":"LIST"));
      }
      else if(data->set.upload) {
        PPSENDF(&conn->proto.ftpc.pp, "PRET STOR %s", conn->proto.ftpc.file);
      }
      else {
        PPSENDF(&conn->proto.ftpc.pp, "PRET RETR %s", conn->proto.ftpc.file);
      }
      state(conn, FTP_PRET);
    }
    else {
      result = ftp_state_use_pasv(conn);
    }
  }
  return result;
}